

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

int32_t icu_63::MeasureUnit::getAvailable
                  (MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  int iVar1;
  int iVar2;
  UBool UVar3;
  int local_38;
  int32_t subTypeIdx;
  int32_t len;
  int32_t typeIdx;
  int32_t idx;
  UErrorCode *errorCode_local;
  int32_t destCapacity_local;
  MeasureUnit *dest_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    if (destCapacity < 0x1b9) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      dest_local._4_4_ = 0x1b9;
    }
    else {
      len = 0;
      for (subTypeIdx = 0; subTypeIdx < 0x14; subTypeIdx = subTypeIdx + 1) {
        iVar1 = *(int *)(gOffsets + (long)(subTypeIdx + 1) * 4);
        iVar2 = *(int *)(gOffsets + (long)subTypeIdx * 4);
        for (local_38 = 0; local_38 < iVar1 - iVar2; local_38 = local_38 + 1) {
          setTo(dest + len,subTypeIdx,local_38);
          len = len + 1;
        }
      }
      dest_local._4_4_ = 0x1b9;
    }
  }
  else {
    dest_local._4_4_ = 0;
  }
  return dest_local._4_4_;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    if (destCapacity < UPRV_LENGTHOF(gSubTypes)) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return UPRV_LENGTHOF(gSubTypes);
    }
    int32_t idx = 0;
    for (int32_t typeIdx = 0; typeIdx < UPRV_LENGTHOF(gTypes); ++typeIdx) {
        int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
        for (int32_t subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
            dest[idx].setTo(typeIdx, subTypeIdx);
            ++idx;
        }
    }
    U_ASSERT(idx == UPRV_LENGTHOF(gSubTypes));
    return UPRV_LENGTHOF(gSubTypes);
}